

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genLoadRelationFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  string *psVar1;
  size_t sVar2;
  TDNode *pTVar3;
  ulong uVar4;
  long lVar5;
  string rel_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string *local_3f8;
  string local_3f0;
  string returnString;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_3f8 = __return_storage_ptr__;
  offset_abi_cxx11_(&local_350,this,1);
  std::operator+(&local_370,&local_350,"void loadRelations()\n");
  offset_abi_cxx11_(&local_390,this,1);
  std::operator+(&local_418,&local_370,&local_390);
  std::operator+(&local_438,&local_418,"{\n");
  offset_abi_cxx11_(&local_3f0,this,2);
  std::operator+(&local_458,&local_438,&local_3f0);
  std::operator+(&local_478,&local_458,"std::ifstream input;\n");
  offset_abi_cxx11_(&local_3b0,this,2);
  std::operator+(&rel_name,&local_478,&local_3b0);
  std::operator+(&returnString,&rel_name,"std::string line;\n");
  std::__cxx11::string::~string((string *)&rel_name);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  uVar4 = 0;
  while( true ) {
    sVar2 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar2 <= uVar4) break;
    pTVar3 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar4);
    std::__cxx11::string::string((string *)&rel_name,(string *)pTVar3);
    offset_abi_cxx11_(&local_418,this,2);
    std::operator+(&local_438,"\n",&local_418);
    std::operator+(&local_458,&local_438,&rel_name);
    std::operator+(&local_478,&local_458,".clear();\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
    offset_abi_cxx11_(&local_170,this,2);
    std::operator+(&local_150,&local_170,"input.open(PATH_TO_DATA + \"/");
    std::operator+(&local_130,&local_150,&rel_name);
    std::operator+(&local_330,&local_130,".tbl\");\n");
    offset_abi_cxx11_(&local_190,this,2);
    std::operator+(&local_110,&local_330,&local_190);
    std::operator+(&local_310,&local_110,"if (!input)\n");
    offset_abi_cxx11_(&local_1b0,this,2);
    std::operator+(&local_f0,&local_310,&local_1b0);
    std::operator+(&local_2f0,&local_f0,"{\n");
    offset_abi_cxx11_(&local_1d0,this,3);
    std::operator+(&local_d0,&local_2f0,&local_1d0);
    std::operator+(&local_b0,&local_d0,"std::cerr << PATH_TO_DATA + \"");
    std::operator+(&local_90,&local_b0,&rel_name);
    std::operator+(&local_2d0,&local_90,".tbl does is not exist. \\n\";\n");
    offset_abi_cxx11_(&local_1f0,this,3);
    std::operator+(&local_70,&local_2d0,&local_1f0);
    std::operator+(&local_2b0,&local_70,"exit(1);\n");
    offset_abi_cxx11_(&local_210,this,2);
    std::operator+(&local_50,&local_2b0,&local_210);
    std::operator+(&local_290,&local_50,"}\n");
    offset_abi_cxx11_(&local_230,this,2);
    std::operator+(&local_3b0,&local_290,&local_230);
    std::operator+(&local_3f0,&local_3b0,"while(getline(input, line))\n");
    offset_abi_cxx11_(&local_250,this,3);
    std::operator+(&local_390,&local_3f0,&local_250);
    std::operator+(&local_350,&local_390,&rel_name);
    std::operator+(&local_370,&local_350,".push_back(");
    std::operator+(&local_418,&local_370,&rel_name);
    std::operator+(&local_438,&local_418,"_tuple(line));\n");
    offset_abi_cxx11_(&local_270,this,2);
    std::operator+(&local_458,&local_438,&local_270);
    std::operator+(&local_478,&local_458,"input.close();\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&rel_name);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::string::append((char *)&returnString);
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    sVar2 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar2 <= uVar4) break;
    offset_abi_cxx11_(&local_458,this,2);
    std::operator+(&local_478,&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(this->viewName->_M_dataplus)._M_p + lVar5));
    std::operator+(&rel_name,&local_478,".reserve(1000000);\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&rel_name);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x20;
  }
  offset_abi_cxx11_(&local_478,this,1);
  std::operator+(&rel_name,&returnString,&local_478);
  psVar1 = local_3f8;
  std::operator+(local_3f8,&rel_name,"}\n");
  std::__cxx11::string::~string((string *)&rel_name);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&returnString);
  return psVar1;
}

Assistant:

std::string CppGenerator::genLoadRelationFunction()
{
    std::string returnString = offset(1)+"void loadRelations()\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        std::string rel_name = _td->getRelation(rel)->_name;
        
        returnString += "\n"+offset(2)+rel_name+".clear();\n";

        returnString += offset(2)+"input.open(PATH_TO_DATA + \"/"+rel_name+".tbl\");\n"+
            offset(2)+"if (!input)\n"+offset(2)+"{\n"+
            offset(3)+"std::cerr << PATH_TO_DATA + \""+rel_name+
            ".tbl does is not exist. \\n\";\n"+
            offset(3)+"exit(1);\n"+offset(2)+"}\n"+
            offset(2)+"while(getline(input, line))\n"+
            offset(3)+rel_name+".push_back("+rel_name+"_tuple(line));\n"+
            offset(2)+"input.close();\n";            
    }

    // Reserving space for the views to speed up push tuples to them.
    returnString += "\n";
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        returnString += offset(2)+viewName[viewID]+".reserve(1000000);\n";

    return returnString+offset(1)+"}\n";
}